

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O3

bool __thiscall cmInstallCommandArguments::CheckPermissions(cmInstallCommandArguments *this)

{
  bool bVar1;
  pointer onePermission;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->PermissionsString,0,(char *)(this->PermissionsString)._M_string_length,
             0x66eafa);
  onePermission =
       (this->Permissions).Vector.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (onePermission ==
      (this->Permissions).Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    do {
      bVar1 = CheckPermissions(onePermission,&this->PermissionsString);
      if (!bVar1) {
        return bVar1;
      }
      onePermission = onePermission + 1;
    } while (onePermission !=
             (this->Permissions).Vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar1;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions()
{
  this->PermissionsString = "";
  for (std::vector<std::string>::const_iterator permIt =
         this->Permissions.GetVector().begin();
       permIt != this->Permissions.GetVector().end(); ++permIt) {
    if (!this->CheckPermissions(*permIt, this->PermissionsString)) {
      return false;
    }
  }
  return true;
}